

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Joint::Joint(Joint *this,Skeleton *s)

{
  Vector3D local_38;
  
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00274968;
  (this->kids).
  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->kids).
  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->kids).
  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->axis).x = 0.0;
  (this->axis).y = 0.0;
  (this->axis).z = 0.0;
  (this->ikAngleGradient).z = 0.0;
  (this->ikAngleGradient).x = 0.0;
  (this->ikAngleGradient).y = 0.0;
  this->skeleton = s;
  this->capsuleRadius = 0.05;
  this->renderScale = 1.0;
  (this->super_SceneObject).scale.x = 1.0;
  (this->super_SceneObject).scale.y = 1.0;
  (this->super_SceneObject).scale.z = 1.0;
  local_38.x = 1.0;
  local_38.y = 1.0;
  local_38.z = 1.0;
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,0.0,&local_38);
  return;
}

Assistant:

Joint :: Joint(Skeleton * s)
   : skeleton( s ), capsuleRadius( 0.05 ), renderScale( 1.0 )
   {
     scale = Vector3D(1., 1., 1.);
     scales.setValue(0, scale);
   }